

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_value.c
# Opt level: O2

int mpt_print_value(mpt_value *val,_func_ssize_t_void_ptr_char_ptr_size_t *save,void *dest)

{
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  ssize_t sVar4;
  mpt_type_traits *pmVar5;
  ulong uVar6;
  size_t sVar7;
  ssize_t sVar8;
  undefined8 *puVar9;
  uint uVar10;
  ulong uVar11;
  void *ptr;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  undefined8 *local_158;
  size_t len;
  mpt_value pos;
  char buf [256];
  
  ptr = val->_addr;
  if ((undefined8 *)ptr == (undefined8 *)0x0) {
    return -2;
  }
  iVar2 = (int)val->_type;
  if (iVar2 == 0x80) {
    if (*ptr != (mpt_convertable *)0x0) {
      iVar2 = mpt_print_convertable(*ptr,save,dest);
      return iVar2;
    }
  }
  else {
    if (iVar2 != 0x84) {
      pcVar3 = mpt_data_tostring(&ptr,(long)iVar2,&len);
      if (pcVar3 == (char *)0x0) {
        uVar10 = iVar2 + 0x20U & 0xff;
        if (uVar10 != 0 && 0xffffffe5 < iVar2 - 0x5aU) {
          local_168 = (ulong)uVar10;
          pmVar5 = mpt_type_traits(local_168);
          pvVar1 = ptr;
          if (pmVar5 == (mpt_type_traits *)0x0) {
            return -3;
          }
          if (pmVar5->size == 0) {
            return -3;
          }
          uVar6 = (*save)(dest,"[ ",2);
          if ((int)uVar6 < 2) {
            return -0x11;
          }
          if (pvVar1 != (void *)0x0) {
            puVar9 = *pvVar1;
            local_178 = pmVar5->size;
            local_170 = *(ulong *)((long)pvVar1 + 8) / local_178;
            for (uVar11 = 0; uVar11 < local_170; uVar11 = uVar11 + 1) {
              local_160 = uVar6;
              local_158 = puVar9;
              if (uVar10 == 0x73) {
                pcVar3 = (char *)*puVar9;
                if (pcVar3 == (char *)0x0) {
                  iVar2 = 0;
                  pcVar3 = "";
                }
                else {
                  sVar7 = strlen(pcVar3);
                  iVar2 = (int)sVar7;
                }
              }
              else {
                pos._type = local_168;
                pcVar3 = buf;
                pos._addr = puVar9;
                iVar2 = mpt_number_tostring(&pos,(mpt_value_format)0x0,pcVar3,0x100);
                if (iVar2 < 0) {
                  return iVar2;
                }
              }
              sVar4 = (*save)(dest,pcVar3,(long)iVar2);
              if ((int)sVar4 < iVar2) {
                return -0x11;
              }
              sVar8 = (*save)(dest," ",1);
              if ((int)sVar8 < 1) {
                return -0x11;
              }
              uVar6 = (ulong)(uint)((int)local_160 + (int)sVar4 + (int)sVar8);
              puVar9 = (undefined8 *)((long)local_158 + local_178);
            }
          }
          sVar4 = (*save)(dest,"]",1);
          if (-1 < (int)sVar4) {
            return (int)uVar6 + (int)sVar4;
          }
          return -0x11;
        }
        uVar10 = mpt_number_tostring(val,(mpt_value_format)0x0,buf,0x100);
        if ((int)uVar10 < 0) {
          return uVar10;
        }
        len = (size_t)uVar10;
        pcVar3 = buf;
      }
      sVar4 = (*save)(dest,pcVar3,len);
      return (int)sVar4;
    }
    if (*ptr != (mpt_object *)0x0) {
      iVar2 = mpt_print_object(*ptr,save,dest);
      return iVar2;
    }
  }
  return 0;
}

Assistant:

extern int mpt_print_value(const MPT_STRUCT(value) *val, ssize_t (*save)(void *, const char *, size_t), void *dest)
{
	static const MPT_STRUCT(value_format) vfmt = MPT_VALFMT_INIT;
	const void *ptr;
	const char *str;
	size_t len;
	int type, curr, adv;
	char buf[256];
	
	/* missing content */
	if (!(ptr = val->_addr)) {
		return MPT_ERROR(BadValue);
	}
	/* object type */
	type = val->_type;
	if (type == MPT_ENUM(TypeObjectPtr)) {
		const MPT_INTERFACE(object) *obj = *(const void **) ptr;
		return obj ? mpt_print_object(obj, save, dest) : 0;
	}
	/* convertable type */
	if (type == MPT_ENUM(TypeConvertablePtr)) {
		MPT_INTERFACE(convertable) *conv = *(void **) ptr;
		return conv ? mpt_print_convertable(conv, save, dest) : 0;
	}
	if ((str = mpt_data_tostring(&ptr, type, &len))) {
		return save(dest, str, len);
	}
	/* vector representation in value */
	if ((curr = MPT_type_toScalar(type)) > 0) {
		const MPT_STRUCT(type_traits) *traits = mpt_type_traits(curr);
		const struct iovec *vec = ptr;
		int total;
		if (!traits || !traits->size) {
			return MPT_ERROR(BadType);
		}
		if ((total = save(dest, "[ ", 2)) < 2) {
			return MPT_ERROR(MissingBuffer);
		}
		if (vec) {
			const uint8_t *data = vec->iov_base;
			size_t i, size = traits->size, max = vec->iov_len / size;
			
			for (i = 0; i < max; i++) {
				const char *str;
				int step;
				if (curr == 's') {
					if ((str = *((const char **) data))) {
						adv = strlen(str);
					}
					else {
						adv = 0;
						str = "";
					}
				}
				else {
					MPT_STRUCT(value) pos = MPT_VALUE_INIT(curr, data);
					adv = mpt_number_tostring(&pos, vfmt, buf, sizeof(buf));
					if (adv < 0) {
						return adv;
					}
					str = buf;
				}
				if ((step = save(dest, str, adv)) < adv) {
					return MPT_ERROR(MissingBuffer);
				}
				total += step;
				if ((step = save(dest, " ", 1)) < 1) {
					return MPT_ERROR(MissingBuffer);
				}
				total += step;
				data  += size;
			}
		}
		if ((adv = save(dest, "]", 1)) < 0) {
			return MPT_ERROR(MissingBuffer);
		}
		return total + adv;
	}
	/* represent numeric value */
	if ((adv = mpt_number_tostring(val, vfmt, buf, sizeof(buf))) >= 0) {
		return save(dest, buf, adv);
	}
	return adv;
}